

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O1

uchar * __thiscall
icu_63::LocalMemory<unsigned_char>::allocateInsteadAndCopy
          (LocalMemory<unsigned_char> *this,int32_t newCapacity,int32_t length)

{
  uchar *__dest;
  
  if (newCapacity < 1) {
    __dest = (uchar *)0x0;
  }
  else {
    __dest = (uchar *)uprv_malloc_63((ulong)(uint)newCapacity);
    if (__dest != (uchar *)0x0) {
      if (0 < length) {
        if (length < newCapacity) {
          newCapacity = length;
        }
        memcpy(__dest,(this->super_LocalPointerBase<unsigned_char>).ptr,(ulong)(uint)newCapacity);
      }
      uprv_free_63((this->super_LocalPointerBase<unsigned_char>).ptr);
      (this->super_LocalPointerBase<unsigned_char>).ptr = __dest;
    }
  }
  return __dest;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndCopy(int32_t newCapacity, int32_t length) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length>0) {
                if(length>newCapacity) {
                    length=newCapacity;
                }
                uprv_memcpy(p, LocalPointerBase<T>::ptr, (size_t)length*sizeof(T));
            }
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}